

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_descriptor.cpp
# Opt level: O3

bool __thiscall
spvtools::opt::Loop::GetInductionInitValue(Loop *this,Instruction *induction,int64_t *value)

{
  byte bVar1;
  IRContext *pIVar2;
  CFG *this_00;
  Instruction *pIVar3;
  ConstantManager *pCVar4;
  Constant *this_01;
  uint64_t *puVar5;
  uint32_t uVar6;
  int iVar7;
  BasicBlock *pBVar8;
  const_iterator cVar9;
  const_iterator cVar10;
  undefined4 extraout_var;
  uint64_t uVar11;
  byte bVar12;
  uint uVar13;
  uint uVar14;
  uint32_t local_54;
  Instruction *local_50;
  uint64_t *local_48;
  DefUseManager *local_40;
  uint32_t local_34;
  
  pIVar2 = this->context_;
  if ((pIVar2->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
    IRContext::BuildDefUseManager(pIVar2);
  }
  bVar1 = induction->has_type_id_;
  bVar12 = induction->has_result_id_;
  uVar13 = (bVar12 & 1) + 1;
  if ((bool)bVar1 == false) {
    uVar13 = (uint)bVar12;
  }
  uVar14 = 0;
  if (uVar13 == (int)((ulong)((long)(induction->operands_).
                                    super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(induction->operands_).
                                   super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x55555555)
  goto LAB_0024052e;
  local_40 = (pIVar2->def_use_mgr_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
             .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl;
  local_50 = (Instruction *)0x0;
  local_48 = (uint64_t *)value;
  do {
    pIVar2 = this->context_;
    if ((pIVar2->valid_analyses_ & kAnalysisCFG) == kAnalysisNone) {
      IRContext::BuildCFG(pIVar2);
      bVar1 = induction->has_type_id_;
      bVar12 = induction->has_result_id_;
    }
    this_00 = (pIVar2->cfg_)._M_t.
              super___uniq_ptr_impl<spvtools::opt::CFG,_std::default_delete<spvtools::opt::CFG>_>.
              _M_t.
              super__Tuple_impl<0UL,_spvtools::opt::CFG_*,_std::default_delete<spvtools::opt::CFG>_>
              .super__Head_base<0UL,_spvtools::opt::CFG_*,_false>._M_head_impl;
    uVar13 = (bVar12 & 1) + 1;
    if ((bVar1 & 1) == 0) {
      uVar13 = (uint)bVar12;
    }
    uVar6 = Instruction::GetSingleWordOperand(induction,uVar13 + uVar14 + 1);
    pBVar8 = CFG::block(this_00,uVar6);
    pIVar3 = (pBVar8->label_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
             .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
    uVar6 = 0;
    if (pIVar3->has_result_id_ == true) {
      uVar6 = Instruction::GetSingleWordOperand(pIVar3,(uint)pIVar3->has_type_id_);
    }
    local_54 = uVar6;
    cVar9 = std::
            _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::find(&(this->loop_basic_blocks_)._M_h,&local_54);
    if (cVar9.super__Node_iterator_base<unsigned_int,_false>._M_cur == (__node_type *)0x0) {
      uVar13 = (induction->has_result_id_ & 1) + 1;
      if (induction->has_type_id_ == false) {
        uVar13 = (uint)induction->has_result_id_;
      }
      uVar6 = Instruction::GetSingleWordOperand(induction,uVar13 + uVar14);
      local_50 = analysis::DefUseManager::GetDef(local_40,uVar6);
    }
    pIVar3 = local_50;
    uVar14 = uVar14 + 2;
    bVar1 = induction->has_type_id_;
    bVar12 = induction->has_result_id_;
    uVar13 = (bVar12 & 1) + 1;
    if ((bool)bVar1 == false) {
      uVar13 = (uint)bVar12;
    }
  } while (uVar14 < (int)((ulong)((long)(induction->operands_).
                                        super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(induction->operands_).
                                       super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                       ._M_impl.super__Vector_impl_data._M_start) >> 4) *
                    -0x55555555 - uVar13);
  if (local_50 != (Instruction *)0x0) {
    pIVar2 = this->context_;
    if ((pIVar2->valid_analyses_ & kAnalysisConstants) == kAnalysisNone) {
      IRContext::BuildConstantManager(pIVar2);
    }
    puVar5 = local_48;
    pCVar4 = (pIVar2->constant_mgr_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::analysis::ConstantManager,_std::default_delete<spvtools::opt::analysis::ConstantManager>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::analysis::ConstantManager_*,_std::default_delete<spvtools::opt::analysis::ConstantManager>_>
             .super__Head_base<0UL,_spvtools::opt::analysis::ConstantManager_*,_false>._M_head_impl;
    local_34 = 0;
    if (pIVar3->has_result_id_ == true) {
      local_34 = Instruction::GetSingleWordOperand(pIVar3,(uint)pIVar3->has_type_id_);
    }
    cVar10 = std::
             _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_const_spvtools::opt::analysis::Constant_*>,_std::allocator<std::pair<const_unsigned_int,_const_spvtools::opt::analysis::Constant_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
             ::find(&(pCVar4->id_to_const_val_)._M_h,&local_34);
    if ((cVar10.
         super__Node_iterator_base<std::pair<const_unsigned_int,_const_spvtools::opt::analysis::Constant_*>,_false>
         ._M_cur != (__node_type *)0x0) &&
       (this_01 = *(Constant **)
                   ((long)cVar10.
                          super__Node_iterator_base<std::pair<const_unsigned_int,_const_spvtools::opt::analysis::Constant_*>,_false>
                          ._M_cur + 0x10), this_01 != (Constant *)0x0)) {
      uVar14 = 1;
      if (puVar5 == (uint64_t *)0x0) goto LAB_0024052e;
      iVar7 = (*this_01->type_->_vptr_Type[10])();
      if (CONCAT44(extraout_var,iVar7) != 0) {
        if (*(char *)(CONCAT44(extraout_var,iVar7) + 0x28) == '\x01') {
          uVar11 = analysis::Constant::GetSignExtendedValue(this_01);
        }
        else {
          uVar11 = analysis::Constant::GetZeroExtendedValue(this_01);
        }
        *puVar5 = uVar11;
        goto LAB_0024052e;
      }
    }
  }
  uVar14 = 0;
LAB_0024052e:
  return SUB41(uVar14,0);
}

Assistant:

bool Loop::GetInductionInitValue(const Instruction* induction,
                                 int64_t* value) const {
  Instruction* constant_instruction = nullptr;
  analysis::DefUseManager* def_use_manager = context_->get_def_use_mgr();

  for (uint32_t operand_id = 0; operand_id < induction->NumInOperands();
       operand_id += 2) {
    BasicBlock* bb = context_->cfg()->block(
        induction->GetSingleWordInOperand(operand_id + 1));

    if (!IsInsideLoop(bb)) {
      constant_instruction = def_use_manager->GetDef(
          induction->GetSingleWordInOperand(operand_id));
    }
  }

  if (!constant_instruction) return false;

  const analysis::Constant* constant =
      context_->get_constant_mgr()->FindDeclaredConstant(
          constant_instruction->result_id());
  if (!constant) return false;

  if (value) {
    const analysis::Integer* type = constant->type()->AsInteger();
    if (!type) {
      return false;
    }

    *value = type->IsSigned() ? constant->GetSignExtendedValue()
                              : constant->GetZeroExtendedValue();
  }

  return true;
}